

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low_level_alloc.cc
# Opt level: O1

int absl::base_internal::LLA_SkiplistLevels(size_t size,size_t base,uint32_t *random)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint32_t uVar5;
  
  uVar1 = size - 0x28;
  iVar2 = 0;
  if (base < size) {
    iVar2 = 0;
    do {
      iVar2 = iVar2 + 1;
      size = size >> 1;
    } while (base < size);
  }
  uVar1 = uVar1 >> 3;
  if (random == (uint32_t *)0x0) {
    iVar4 = 1;
  }
  else {
    uVar5 = *random;
    iVar4 = 0;
    do {
      uVar5 = uVar5 * 0x41c64e6d + 0x3039;
      iVar4 = iVar4 + 1;
    } while ((uVar5 >> 0x1e & 1) == 0);
    *random = uVar5;
  }
  iVar3 = iVar4 + iVar2;
  if (uVar1 < (ulong)(long)(iVar4 + iVar2)) {
    iVar3 = (int)uVar1;
  }
  if (iVar3 < 1) {
    LLA_SkiplistLevels();
  }
  iVar2 = 0x1d;
  if (iVar3 < 0x1d) {
    iVar2 = iVar3;
  }
  return iVar2;
}

Assistant:

static int LLA_SkiplistLevels(size_t size, size_t base, uint32_t *random) {
  // max_fit is the maximum number of levels that will fit in a node for the
  // given size.   We can't return more than max_fit, no matter what the
  // random number generator says.
  size_t max_fit = (size - offsetof(AllocList, next)) / sizeof(AllocList *);
  int level = IntLog2(size, base) + (random != nullptr ? Random(random) : 1);
  if (static_cast<size_t>(level) > max_fit) level = static_cast<int>(max_fit);
  if (level > kMaxLevel-1) level = kMaxLevel - 1;
  ABSL_RAW_CHECK(level >= 1, "block not big enough for even one level");
  return level;
}